

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelaunayMST.h
# Opt level: O2

void __thiscall DelaunayMST::add(DelaunayMST *this,int x,int y)

{
  int iVar1;
  int iVar2;
  EListNode *pEVar3;
  int *piVar4;
  long lVar5;
  
  pEVar3 = (this->e)._M_t.
           super___uniq_ptr_impl<DelaunayMST::EListNode,_std::default_delete<DelaunayMST::EListNode[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_DelaunayMST::EListNode_*,_std::default_delete<DelaunayMST::EListNode[]>_>
           .super__Head_base<0UL,_DelaunayMST::EListNode_*,_false>._M_head_impl;
  piVar4 = (this->last)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  iVar1 = piVar4[x];
  lVar5 = (long)this->eCnt + 1;
  this->eCnt = (int)lVar5;
  pEVar3[lVar5].to = y;
  pEVar3[lVar5].prev = iVar1;
  pEVar3[lVar5].next = 0;
  iVar1 = this->eCnt;
  pEVar3[piVar4[x]].next = iVar1;
  piVar4[x] = iVar1;
  iVar2 = piVar4[y];
  lVar5 = (long)iVar1 + 1;
  this->eCnt = (int)lVar5;
  pEVar3[lVar5].to = x;
  pEVar3[lVar5].prev = iVar2;
  pEVar3[lVar5].next = 0;
  iVar1 = this->eCnt;
  pEVar3[piVar4[y]].next = iVar1;
  piVar4[y] = iVar1;
  return;
}

Assistant:

void add(int x, int y)
	{
		e[++eCnt] = {y, last[x]};
		e[last[x]].next = eCnt, last[x] = eCnt;
		e[++eCnt] = {x, last[y]};
		e[last[y]].next = eCnt, last[y] = eCnt;
	}